

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int incrPhraseTokenNext(Fts3Table *pTab,Fts3Phrase *pPhrase,int iToken,TokenDoclist *p,u8 *pbEof)

{
  Fts3MultiSegReader *pMsr;
  int iVar1;
  
  if (pPhrase->iDoclistToken == iToken) {
    fts3EvalDlPhraseNext(pTab,&pPhrase->doclist,pbEof);
    p->pList = (pPhrase->doclist).pList;
    p->nList = (pPhrase->doclist).nList;
    p->iDocid = (pPhrase->doclist).iDocid;
  }
  else {
    pMsr = pPhrase->aToken[iToken].pSegcsr;
    if (pMsr != (Fts3MultiSegReader *)0x0) {
      iVar1 = sqlite3Fts3MsrIncrNext(pTab,pMsr,&p->iDocid,&p->pList,&p->nList);
      if (p->pList != (char *)0x0) {
        return iVar1;
      }
      *pbEof = '\x01';
      return iVar1;
    }
    p->bIgnore = 1;
  }
  return 0;
}

Assistant:

static int incrPhraseTokenNext(
  Fts3Table *pTab,                /* Virtual table handle */
  Fts3Phrase *pPhrase,            /* Phrase to advance token of */
  int iToken,                     /* Specific token to advance */
  TokenDoclist *p,                /* OUT: Docid and doclist for new entry */
  u8 *pbEof                       /* OUT: True if iterator is at EOF */
){
  int rc = SQLITE_OK;

  if( pPhrase->iDoclistToken==iToken ){
    assert( p->bIgnore==0 );
    assert( pPhrase->aToken[iToken].pSegcsr==0 );
    fts3EvalDlPhraseNext(pTab, &pPhrase->doclist, pbEof);
    p->pList = pPhrase->doclist.pList;
    p->nList = pPhrase->doclist.nList;
    p->iDocid = pPhrase->doclist.iDocid;
  }else{
    Fts3PhraseToken *pToken = &pPhrase->aToken[iToken];
    assert( pToken->pDeferred==0 );
    assert( pToken->pSegcsr || pPhrase->iDoclistToken>=0 );
    if( pToken->pSegcsr ){
      assert( p->bIgnore==0 );
      rc = sqlite3Fts3MsrIncrNext(
          pTab, pToken->pSegcsr, &p->iDocid, &p->pList, &p->nList
      );
      if( p->pList==0 ) *pbEof = 1;
    }else{
      p->bIgnore = 1;
    }
  }

  return rc;
}